

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

char * mctools_basename_view(mcu8str *path)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  
  pcVar3 = path->c_str;
  uVar2 = path->size;
  pcVar7 = pcVar3 + uVar2;
  iVar6 = mctools_impl_has_winnamespace(path);
  cVar5 = mctools_drive_letter(path);
  if (pcVar3 + (ulong)(cVar5 != '\0') * 2 + (ulong)(iVar6 != 0) * 4 != pcVar7) {
    pcVar8 = pcVar3 + uVar2;
    while( true ) {
      pcVar4 = pcVar8;
      pcVar8 = pcVar4 + -1;
      cVar1 = *pcVar8;
      if (pcVar8 <= pcVar3 + (ulong)(cVar5 != '\0') * 2 + (ulong)(iVar6 != 0) * 4) break;
      if ((cVar1 == '/') || (cVar1 == '\\')) goto LAB_0010349d;
    }
    if ((cVar1 != '/') && (cVar1 != '\\')) goto LAB_001034a0;
LAB_0010349d:
    pcVar8 = pcVar4;
LAB_001034a0:
    if ((pcVar8 + 1 != pcVar7) || (*pcVar8 != '.')) {
      pcVar7 = pcVar8;
    }
  }
  return pcVar7;
}

Assistant:

const char * mctools_basename_view( const mcu8str* path )
  {
    const char * itB = path->c_str;
    const char * itE = path->c_str + path->size;
    if ( mctools_impl_has_winnamespace( path ) )
      itB += 4;//skip '\\?\'
    if ( mctools_drive_letter( path ) )
      itB += 2;//skip drive letter
    if ( itB == itE )
      return itE;//empty
    //Find last path sep:
    const char * it = itE - 1;
    while ( it > itB && *it!='/' && *it!='\\' )
      --it;
    if ( *it=='/' || *it=='\\' )
      ++it;
    if ( it+1 == itE && *it == '.' )
      return itE;//empty
    return it;
  }